

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

ImportElems * __thiscall
jsonnet::internal::SortImports::extractImportElems(SortImports *this,Binds *binds,Fodder *after)

{
  size_type sVar1;
  const_reference pvVar2;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_RCX;
  vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_> *in_RDX;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *in_RDI;
  bool bVar3;
  Import *import;
  Bind newBind;
  value_type *next;
  Fodder beforeNext;
  Fodder adjacent;
  bool last;
  value_type *bind;
  int i;
  Fodder before;
  ImportElems *result;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *local_1e8;
  Bind *in_stack_fffffffffffffe20;
  int iVar4;
  int iVar5;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *this_00;
  Bind *in_stack_fffffffffffffe58;
  Bind *in_stack_fffffffffffffe60;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffffe68;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffffe70;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffffeb8;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffffec0;
  SortImports *in_stack_fffffffffffffec8;
  int local_50;
  
  this_00 = in_RDI;
  std::
  vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
  ::vector((vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
            *)0x3640a3);
  std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
  front((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_> *)
        in_stack_fffffffffffffe20);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  local_50 = 0;
  while( true ) {
    iVar5 = local_50;
    sVar1 = std::
            vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
            ::size(in_RDX);
    if ((int)sVar1 <= iVar5) {
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(in_RCX);
      return (ImportElems *)this_00;
    }
    pvVar2 = std::
             vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
             ::operator[](in_RDX,(long)local_50);
    iVar4 = local_50;
    sVar1 = std::
            vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
            ::size(in_RDX);
    bVar3 = iVar4 == (int)sVar1 + -1;
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x36414f);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x36415c);
    if (bVar3) {
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    }
    else {
      std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
      operator[](in_RDX,(long)(local_50 + 1));
      splitFodder(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      std::
      tie<std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>>
                ((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)CONCAT44(iVar5,iVar4),&in_stack_fffffffffffffe20->varFodder);
      std::
      tuple<std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
      ::operator=((tuple<std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_&,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_&>
                   *)in_RCX,
                  (pair<std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
                   *)CONCAT44(iVar5,iVar4));
      std::
      pair<std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
      ::~pair((pair<std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
               *)in_stack_fffffffffffffe20);
    }
    ensureCleanNewline(in_stack_fffffffffffffe70);
    Local::Bind::Bind(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::operator=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    in_stack_fffffffffffffe20 = (Bind *)pvVar2->body;
    if (in_stack_fffffffffffffe20 == (Bind *)0x0) {
      local_1e8 = (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)0x0;
    }
    else {
      local_1e8 = (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)__dynamic_cast(in_stack_fffffffffffffe20,&AST::typeinfo,&Import::typeinfo,0);
    }
    if (local_1e8 ==
        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
         *)0x0) break;
    sortingKey_abi_cxx11_((SortImports *)CONCAT44(iVar5,iVar4),(Import *)in_stack_fffffffffffffe20);
    std::
    vector<jsonnet::internal::SortImports::ImportElem,std::allocator<jsonnet::internal::SortImports::ImportElem>>
    ::
    emplace_back<std::__cxx11::u32string,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Local::Bind&>
              ((vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
                *)this_00,in_RDI,in_RCX,(Bind *)CONCAT44(iVar5,iVar4));
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_stack_fffffffffffffe20);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::operator=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    Local::Bind::~Bind(in_stack_fffffffffffffe20);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(in_RCX);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(in_RCX);
    local_50 = local_50 + 1;
    in_stack_fffffffffffffe70 = local_1e8;
  }
  __assert_fail("import != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/formatter.cpp"
                ,0x88e,
                "ImportElems jsonnet::internal::SortImports::extractImportElems(const Local::Binds &, Fodder)"
               );
}

Assistant:

ImportElems extractImportElems(const Local::Binds &binds, Fodder after)
    {
        ImportElems result;
        Fodder before = binds.front().varFodder;
        for (int i = 0; i < int(binds.size()); ++i) {
            const auto &bind = binds[i];
            bool last = i == int(binds.size() - 1);
            Fodder adjacent, beforeNext;
            if (!last) {
                auto &next = binds[i + 1];
                std::tie(adjacent, beforeNext) = splitFodder(next.varFodder);
            } else {
                adjacent = after;
            }
            ensureCleanNewline(adjacent);
            Local::Bind newBind = bind;
            newBind.varFodder = before;
            Import *import = dynamic_cast<Import *>(bind.body);
            assert(import != nullptr);
            result.emplace_back(sortingKey(import), adjacent, newBind);
            before = beforeNext;
        }
        return result;
    }